

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O3

bool whisper_sched_graph_init
               (whisper_sched *allocr,
               vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> backends,
               function<ggml_cgraph_*()> *get_graph)

{
  char cVar1;
  ggml_backend_sched_t pgVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  long in_RCX;
  long in_RDX;
  
  pgVar2 = (ggml_backend_sched_t)
           ggml_backend_sched_new(get_graph,0,(ulong)(in_RDX - (long)get_graph) >> 3,0x1000,0);
  allocr->sched = pgVar2;
  lVar3 = ggml_tensor_overhead();
  lVar4 = ggml_graph_overhead();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&allocr->meta,lVar3 * 0x1000 + lVar4);
  if (*(long *)(in_RCX + 0x10) != 0) {
    pgVar2 = allocr->sched;
    uVar5 = (**(code **)(in_RCX + 0x18))();
    cVar1 = ggml_backend_sched_alloc_graph(pgVar2,uVar5);
    if (cVar1 == '\0') {
      whisper_log_internal
                (GGML_LOG_LEVEL_ERROR,"%s: failed to allocate the compute buffer\n",
                 "whisper_sched_graph_init");
    }
    else {
      ggml_backend_sched_reset(allocr->sched);
    }
    return (bool)cVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

static bool whisper_sched_graph_init(struct whisper_sched & allocr, std::vector<ggml_backend_t> backends, std::function<struct ggml_cgraph *()> && get_graph) {
    auto & sched = allocr.sched;
    auto & meta  = allocr.meta;

    sched = ggml_backend_sched_new(backends.data(), nullptr, backends.size(), WHISPER_MAX_NODES, false);

    meta.resize(ggml_tensor_overhead()*WHISPER_MAX_NODES + ggml_graph_overhead());

    // since there are dependencies between the different graphs,
    // we need to allocate them instead of only reserving to get the correct compute buffer size
    if (!ggml_backend_sched_alloc_graph(sched, get_graph())) {
        // failed to allocate the compute buffer
        WHISPER_LOG_ERROR("%s: failed to allocate the compute buffer\n", __func__);
        return false;
    }

    ggml_backend_sched_reset(sched);

    return true;
}